

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# viras.h
# Opt level: O0

FlattenIter<viras::iter::MapIter<viras::iter::FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:367:39)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:136:26)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:207:24)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:253:26)>_>
* __thiscall
viras::
Viras<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RealConstantType>_>,_viras::DefaultOpts>_>
::quantifier_elimination
          (Viras<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
           *this,Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
                 *x,
          vector<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
          *lits)

{
  type f;
  FlattenIter<viras::iter::MapIter<viras::iter::FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:367:39)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:136:26)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:207:24)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:253:26)>_>
  *in_RDI;
  anon_class_1_0_00000001 *in_stack_fffffffffffffa60;
  undefined8 uStack_598;
  undefined8 in_stack_fffffffffffffa70;
  undefined8 in_stack_fffffffffffffa78;
  undefined8 in_stack_fffffffffffffa80;
  TermList in_stack_fffffffffffffa88;
  FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:367:39)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:136:26)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:207:24)>
  *in_stack_ffffffffffffff68;
  IterCombinator<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:54:31)>_conflict2
  in_stack_ffffffffffffff80;
  vector<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
  *in_stack_ffffffffffffffa8;
  Var<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  *in_stack_ffffffffffffffb0;
  Viras<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  *in_stack_ffffffffffffffb8;
  
  elim_set(in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  f.lits = (vector<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>,_std::allocator<viras::LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>_>_>
            *)in_stack_fffffffffffffa78;
  f.this = (Viras<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
            *)in_stack_fffffffffffffa70;
  f.x.
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::VarWrapper>
  .config = (Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>
             *)in_stack_fffffffffffffa80;
  f.x.
  super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>::VarWrapper>
  .inner.super_TermList._content = (TermList)(TermList)in_stack_fffffffffffffa88._content;
  viras::iter::$_14::operator()(in_stack_fffffffffffffa60,f);
  viras::iter::
  operator|<viras::iter::FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:367:39)>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_h:136:26)>_>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_vprover[P]vampire_viras_src_viras_iter_h:207:24)>_>
            (in_stack_ffffffffffffff68,in_stack_ffffffffffffff80);
  viras::iter::
  FilterIter<viras::iter::FlattenIter<viras::iter::MapIter<viras::iter::MapIter<viras::iter::RangeIter<unsigned_long>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:367:39)>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras.h:136:26)>_>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/vprover[P]vampire/viras/src/viras/iter.h:207:24)>
  ::~FilterIter(uStack_598);
  return in_RDI;
}

Assistant:

auto quantifier_elimination(Var<C> const& x, std::vector<LiraLiteral<C>> const& lits)
    { return elim_set(x, lits)
        | iter::flat_map([this,&lits,x](auto t) { return vsubs(lits, x, t); }); }